

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O0

expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
* __thiscall
jaegertracing::Tracer::Extract
          (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
           *__return_storage_ptr__,Tracer *this,HTTPHeadersReader *reader)

{
  bool bVar1;
  SpanContext *this_00;
  value_type local_1a8;
  undefined4 local_19c;
  value_type local_198 [3];
  SpanContext local_180;
  undefined1 local_d0 [8];
  SpanContext spanContext;
  HTTPHeadersReader *reader_local;
  Tracer *this_local;
  
  spanContext._mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)reader;
  propagation::
  Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  ::extract((SpanContext *)local_d0,
            &(this->_httpHeaderPropagator).
             super_Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
            ,reader);
  SpanContext::SpanContext(&local_180);
  bVar1 = jaegertracing::operator==((SpanContext *)local_d0,&local_180);
  SpanContext::~SpanContext(&local_180);
  if (bVar1) {
    std::unique_ptr<opentracing::v3::SpanContext,std::default_delete<opentracing::v3::SpanContext>>
    ::unique_ptr<std::default_delete<opentracing::v3::SpanContext>,void>
              ((unique_ptr<opentracing::v3::SpanContext,std::default_delete<opentracing::v3::SpanContext>>
                *)local_198);
    opentracing::v3::
    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
    ::expected<true,_0>(__return_storage_ptr__,local_198);
    std::
    unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>::
    ~unique_ptr(local_198);
  }
  else {
    this_00 = (SpanContext *)operator_new(0xb0);
    SpanContext::SpanContext(this_00,(SpanContext *)local_d0);
    std::unique_ptr<opentracing::v3::SpanContext,std::default_delete<opentracing::v3::SpanContext>>
    ::unique_ptr<std::default_delete<opentracing::v3::SpanContext>,void>
              ((unique_ptr<opentracing::v3::SpanContext,std::default_delete<opentracing::v3::SpanContext>>
                *)&local_1a8,(pointer)this_00);
    opentracing::v3::
    expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
    ::expected<true,_0>(__return_storage_ptr__,&local_1a8);
    std::
    unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>::
    ~unique_ptr(&local_1a8);
  }
  local_19c = 1;
  SpanContext::~SpanContext((SpanContext *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<std::unique_ptr<opentracing::SpanContext>>
    Extract(const opentracing::HTTPHeadersReader& reader) const override
    {
        const auto spanContext = _httpHeaderPropagator.extract(reader);
        if (spanContext == SpanContext()) {
            return std::unique_ptr<opentracing::SpanContext>();
        }
        return std::unique_ptr<opentracing::SpanContext>(
            new SpanContext(spanContext));
    }